

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

int __thiscall
notch::core::SoftmaxWithLoss::clone
          (SoftmaxWithLoss *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  element_type *peVar1;
  shared_ptr<notch::core::SoftmaxWithLoss> sVar2;
  SharedBuffers local_48;
  shared_ptr<notch::core::SoftmaxWithLoss> c;
  SoftmaxWithLoss *this_local;
  
  c.super___shared_ptr<notch::core::SoftmaxWithLoss,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)__fn;
  sVar2 = ::std::make_shared<notch::core::SoftmaxWithLoss,notch::core::SoftmaxWithLoss_const&>
                    ((SoftmaxWithLoss *)&stack0xffffffffffffffd8);
  SharedBuffers::clone
            (&local_48,__fn + 8,
             sVar2.super___shared_ptr<notch::core::SoftmaxWithLoss,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._M_pi,__flags,__arg);
  peVar1 = std::
           __shared_ptr_access<notch::core::SoftmaxWithLoss,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<notch::core::SoftmaxWithLoss,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&stack0xffffffffffffffd8);
  SharedBuffers::operator=(&(peVar1->super_ALossLayer).shared,&local_48);
  SharedBuffers::~SharedBuffers(&local_48);
  ::std::shared_ptr<notch::core::ALossLayer>::shared_ptr<notch::core::SoftmaxWithLoss,void>
            ((shared_ptr<notch::core::ALossLayer> *)this,
             (shared_ptr<notch::core::SoftmaxWithLoss> *)&stack0xffffffffffffffd8);
  std::shared_ptr<notch::core::SoftmaxWithLoss>::~shared_ptr
            ((shared_ptr<notch::core::SoftmaxWithLoss> *)&stack0xffffffffffffffd8);
  return (int)this;
}

Assistant:

virtual std::shared_ptr<ALossLayer> clone() const {
        auto c = std::make_shared<SoftmaxWithLoss>(*this);
        c->shared = shared.clone();
        return c;
    }